

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::PrintPresetList(cmake *this,cmCMakePresetsGraph *graph)

{
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_28;
  
  local_28.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetRegisteredGenerators(this,&local_28,false);
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:1839:5)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:1839:5)>
             ::_M_manager;
  local_48._M_unused._M_object = &local_28;
  cmCMakePresetsGraph::PrintConfigurePresetList
            (graph,(function<bool_(const_cmCMakePresetsGraph::ConfigurePreset_&)> *)&local_48,
             (PrintPrecedingNewline *)0x0);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector(&local_28);
  return;
}

Assistant:

void cmake::PrintPresetList(const cmCMakePresetsGraph& graph) const
{
  std::vector<GeneratorInfo> generators;
  this->GetRegisteredGenerators(generators, false);
  auto filter =
    [&generators](const cmCMakePresetsGraph::ConfigurePreset& preset) -> bool {
    if (preset.Generator.empty()) {
      return true;
    }
    auto condition = [&preset](const GeneratorInfo& info) -> bool {
      return info.name == preset.Generator;
    };
    auto it = std::find_if(generators.begin(), generators.end(), condition);
    return it != generators.end();
  };

  graph.PrintConfigurePresetList(filter);
}